

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Al.cpp
# Opt level: O0

void Al::Finalize(void)

{
  long lVar1;
  ProgressEngine *in_stack_00000010;
  ProgressEngine *in_stack_00000060;
  
  if (((anonymous_namespace)::is_initialized & 1) != 0) {
    internal::ProgressEngine::stop(in_stack_00000060);
    lVar1 = (anonymous_namespace)::progress_engine;
    if ((anonymous_namespace)::progress_engine != 0) {
      internal::ProgressEngine::~ProgressEngine(in_stack_00000010);
      operator_delete(lVar1,0x8100,0x80);
    }
    (anonymous_namespace)::progress_engine = 0;
    internal::MemoryPool::clear((MemoryPool *)0x12cdcc);
    (anonymous_namespace)::is_initialized = 0;
    internal::mpi::finalize();
    internal::trace::write_trace_to_file();
  }
  return;
}

Assistant:

void Finalize() {
  // Make calling Finalize multiple times safely.
  if (!is_initialized) {
    return;
  }
  // Finalize in reverse order of initialization.
#ifdef AL_HAS_HOST_TRANSFER
  internal::ht::finalize();
#endif
#ifdef AL_HAS_MPI_CUDA
  internal::mpi_cuda::finalize();
#endif
#ifdef AL_HAS_NCCL
  internal::nccl::finalize();
#endif
#ifdef AL_HAS_CUDA
  internal::cuda::finalize();
#endif
  progress_engine->stop();
  delete progress_engine;
  progress_engine = nullptr;
  // Clear host memory pool.
  internal::mempool.clear();
  is_initialized = false;
  internal::mpi::finalize();
  internal::trace::write_trace_to_file();
}